

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

int cmdParse(char *buf,uint32_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  uint32_t *val;
  char cVar1;
  char *pcVar2;
  int8_t *val_00;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  void *pvVar6;
  size_t sVar7;
  uint32_t uVar8;
  int *piVar9;
  char *pcVar10;
  uint uVar11;
  uint32_t *puVar12;
  long lVar13;
  int i;
  long lVar14;
  int n;
  uint32_t tp1;
  char *local_78;
  int8_t to3;
  char c;
  uint32_t *local_68;
  int8_t to5;
  int8_t to4;
  int8_t *local_58;
  uint32_t tp3;
  uint32_t tp2;
  uint32_t *local_48;
  uint32_t tp5;
  uint32_t tp4;
  int pp;
  
  tp1 = 0;
  tp2 = 0;
  tp3 = 0;
  tp4 = 0;
  tp5 = 0;
  if (ext_len < 0x800) {
    return -3;
  }
  ctl->opt[0] = '\0';
  ctl->opt[1] = '\0';
  ctl->opt[2] = '\0';
  ctl->opt[3] = '\0';
  lVar14 = 0;
  local_78 = buf;
  local_68 = (uint32_t *)ext;
  __isoc99_sscanf(buf + ctl->eaten," %31s %n",intCmdStr,&pp);
  ctl->eaten = ctl->eaten + pp;
  *p = 0xffffffff;
  piVar9 = &cmdInfo[0].vt;
  while( true ) {
    if (lVar14 == 0xa8) {
      return -1;
    }
    iVar3 = strcasecmp(intCmdStr,*(char **)(piVar9 + -2));
    pcVar2 = local_78;
    if (iVar3 == 0) break;
    lVar14 = lVar14 + 1;
    piVar9 = piVar9 + 6;
  }
  *p = ((cmdInfo_t *)(piVar9 + -4))->cmd;
  puVar12 = p + 1;
  p[1] = 0;
  p[2] = 0;
  val = p + 2;
  p[3] = 0;
  local_58 = (int8_t *)val;
  switch(*piVar9) {
  case 0x65:
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x81:
  case 0x82:
    return -2;
  case 0x6f:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    cVar1 = ctl->opt[1];
    goto joined_r0x001212fd;
  case 0x70:
    lVar13 = (long)ctl->eaten;
    goto LAB_0012138d;
  case 0x71:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    uVar11 = *puVar12;
    goto joined_r0x00121467;
  case 0x72:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] != '\x01') {
      return -2;
    }
    break;
  case 0x73:
    sVar7 = strlen(local_78 + ctl->eaten);
    p[3] = (uint32_t)sVar7;
    memcpy(local_68,pcVar2 + ctl->eaten,sVar7 & 0xffffffff);
    _c = p[3];
    goto LAB_001214da;
  case 0x74:
    iVar3 = __isoc99_sscanf(local_78 + ctl->eaten," %*s%n %n",&n,&c);
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    p[3] = n;
    ctl->opt[3] = '\x01';
    memcpy(local_68,local_78 + ctl->eaten,(long)n);
LAB_001214da:
    ctl->eaten = ctl->eaten + _c;
    break;
  case 0x79:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (((ctl->opt[1] < '\x01') || ((int)*puVar12 < 0)) || (ctl->opt[2] < '\x01')) {
      return -2;
    }
    uVar8 = *val;
    goto joined_r0x00121404;
  case 0x7a:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    goto LAB_001212f6;
  case 0x7b:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar12) {
      return -2;
    }
LAB_001212f6:
    cVar1 = ctl->opt[2];
joined_r0x001212fd:
    if (cVar1 < '\x01') {
      return -2;
    }
    break;
  case 0x7c:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar12) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    uVar11 = *val;
joined_r0x00121467:
    if (0x95 < uVar11) {
      return -2;
    }
    break;
  case 0x7d:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = __isoc99_sscanf(pcVar2 + lVar13," %c %n",&c,&n);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar3 < 1) {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + n;
    pp_Var5 = __ctype_toupper_loc();
    pvVar6 = memchr("RW540123",(*pp_Var5)[c],9);
    if (pvVar6 == (void *)0x0) {
      return -2;
    }
    iVar3 = 0x1278aa;
    goto LAB_00121139;
  case 0x7e:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = __isoc99_sscanf(pcVar2 + lVar13," %c %n",&c,&n);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar3 < 1) {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + n;
    pp_Var5 = __ctype_toupper_loc();
    pvVar6 = memchr("ODU",(*pp_Var5)[c],4);
    if (pvVar6 == (void *)0x0) {
      return -2;
    }
    iVar3 = 0x1278b3;
LAB_00121139:
    *val = (int)pvVar6 - iVar3;
    break;
  case 0x7f:
    local_48 = puVar12;
    iVar3 = __isoc99_sscanf(local_78 + ctl->eaten," %*s%n %n",&n,&c);
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    p[3] = n;
    ctl->opt[2] = '\x01';
    memcpy(local_68,pcVar2 + ctl->eaten,(long)n);
    lVar13 = (long)ctl->eaten + (long)(int)_c;
    ctl->eaten = (int)lVar13;
    puVar12 = local_48;
LAB_0012138d:
    iVar3 = getNum(pcVar2 + lVar13,puVar12,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    uVar8 = *puVar12;
    goto joined_r0x00121404;
  case 0x80:
    iVar3 = __isoc99_sscanf(local_78 + ctl->eaten," %*s%n %n",&n,&c);
    puVar12 = local_68;
    pcVar2 = local_78;
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    local_58 = (int8_t *)(long)n;
    p[1] = n;
    memcpy(local_68,local_78 + ctl->eaten,(size_t)local_58);
    ctl->eaten = ctl->eaten + n;
    pcVar10 = (char *)((long)puVar12 + (long)local_58);
    *pcVar10 = '\0';
    iVar3 = ctl->eaten;
    sVar7 = strlen(pcVar2 + (long)iVar3 + 1);
    memcpy(pcVar10 + 1,pcVar2 + (long)iVar3 + 1,(long)(int)sVar7);
    iVar3 = (int)sVar7 + 1;
    ctl->eaten = ctl->eaten + iVar3;
    p[3] = iVar3 + p[1];
    break;
  case 0x83:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp1,ctl->opt + 3);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    if ((int)*(uint32_t *)local_58 < 0) {
      return -2;
    }
    if ((int)tp1 < 0 || ctl->opt[3] < '\x01') {
      return -2;
    }
    goto LAB_001211f1;
  case 0x84:
    local_48 = puVar12;
    iVar3 = __isoc99_sscanf(local_78 + ctl->eaten," %*s%n %n",&n,&c);
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    p[3] = n;
    ctl->opt[2] = '\x01';
    memcpy(local_68,pcVar2 + ctl->eaten,(long)n);
    puVar12 = local_48;
    lVar13 = (long)ctl->eaten + (long)(int)_c;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,local_48,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,(uint32_t *)local_58,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    uVar8 = *(uint32_t *)local_58;
joined_r0x00121404:
    if ((int)uVar8 < 0) {
      return -2;
    }
    break;
  case 0x85:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    val_00 = local_58;
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    local_58 = ctl->opt + 2;
    iVar3 = getNum(pcVar2 + lVar13,(uint32_t *)val_00,local_58);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp1,(int8_t *)&n);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    if (((int)tp1 < 0 || (char)n != '\x01') || *local_58 < '\x01') {
      return -2;
    }
LAB_001211f1:
    p[3] = 4;
    *local_68 = tp1;
    break;
  case 0x86:
    iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp1,(int8_t *)&n);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp2,&c);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp3,&to3);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp4,&to4);
    lVar13 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar3 = getNum(pcVar2 + lVar13,&tp5,&to5);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar12 < 0) {
      return -2;
    }
    if ((char)n != '\x01') {
      return -2;
    }
    if ((int)tp1 < 0) {
      return -2;
    }
    if (c != '\x01') {
      return -2;
    }
    if ((int)tp2 < 0) {
      return -2;
    }
    if (to3 != '\x01') {
      return -2;
    }
    if ((int)tp3 < 0) {
      return -2;
    }
    if (to4 != '\x01') {
      return -2;
    }
    if ((int)tp4 < 0) {
      return -2;
    }
    if (to5 != '\x01') {
      return -2;
    }
    p[3] = 0x14;
    *local_68 = tp1;
    local_68[1] = tp2;
    local_68[2] = tp3;
    local_68[3] = tp4;
    local_68[4] = tp5;
    break;
  default:
    switch(*piVar9) {
    case 0xbf:
      iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
      ctl->eaten = ctl->eaten + iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((int)*puVar12 < 0) {
        return -2;
      }
      for (lVar13 = 0; (int)lVar13 != 0x28; lVar13 = lVar13 + 4) {
        iVar3 = getNum(local_78 + ctl->eaten,&tp1,(int8_t *)&n);
        ctl->eaten = ctl->eaten + iVar3;
        if ((char)n != '\x01') break;
        *(uint32_t *)((long)local_68 + lVar13) = tp1;
      }
      goto LAB_0012191a;
    case 0xc0:
      iVar3 = 0;
      uVar11 = 0;
      for (lVar13 = 0; uVar8 = (uint32_t)lVar13, uVar8 != 0x800; lVar13 = lVar13 + 4) {
        iVar4 = getNum(local_78 + ctl->eaten,&tp1,(int8_t *)&n);
        ctl->eaten = ctl->eaten + iVar4;
        if ((char)n != '\x01') break;
        uVar11 = uVar11 + 1;
        *(uint32_t *)((long)local_68 + lVar13) = tp1;
        iVar3 = iVar3 + -1;
      }
      p[3] = uVar8;
      if (iVar3 + (uVar11 / 3) * 3 != 0 || uVar8 == 0) {
        return -2;
      }
      break;
    case 0xc1:
      iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
      iVar3 = iVar3 + ctl->eaten;
      ctl->eaten = iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((int)*puVar12 < 0) {
        return -2;
      }
      for (lVar13 = 0; uVar8 = (uint32_t)lVar13, uVar8 != 0x200; lVar13 = lVar13 + 1) {
        iVar3 = getNum(local_78 + iVar3,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || (0xff < tp1)) {
          p[3] = uVar8;
          if ((uVar8 == 0) && (*p != 0x72)) {
            return -2;
          }
          goto switchD_00120b7a_caseD_65;
        }
        *(char *)((long)local_68 + lVar13) = (char)tp1;
        iVar3 = iVar3 + ctl->eaten;
        ctl->eaten = iVar3;
      }
      goto LAB_0012190f;
    case 0xc2:
      local_48 = puVar12;
      iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
      lVar13 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
      iVar3 = iVar3 + ctl->eaten;
      ctl->eaten = iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((int)*local_48 < 0) {
        return -2;
      }
      if (0xff < *val) {
        return -2;
      }
      for (lVar13 = 0; (int)lVar13 != 0x20; lVar13 = lVar13 + 1) {
        iVar3 = getNum(local_78 + iVar3,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || (0xff < tp1)) goto LAB_00121901;
        *(char *)((long)local_68 + lVar13) = (char)tp1;
        iVar3 = iVar3 + ctl->eaten;
        ctl->eaten = iVar3;
      }
      p[3] = 0x20;
      break;
    case 0xc3:
      iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
      lVar13 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      if (ctl->opt[1] != '\x01') break;
      if ((int)*puVar12 < 0) {
        return -2;
      }
      iVar3 = getNum(local_78 + lVar13,val,ctl->opt + 2);
      iVar3 = iVar3 + ctl->eaten;
      ctl->eaten = iVar3;
      if (ctl->opt[2] != '\x01') break;
      if ((int)*val < 0) {
        return -2;
      }
      for (lVar13 = 0; (int)lVar13 != 0x200; lVar13 = lVar13 + 1) {
        iVar3 = getNum(local_78 + iVar3,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || (0xff < tp1)) break;
        *(char *)((long)local_68 + lVar13) = (char)tp1;
        iVar3 = iVar3 + ctl->eaten;
        ctl->eaten = iVar3;
      }
LAB_0012191a:
      p[3] = (uint32_t)lVar13;
      break;
    case 0xc4:
      local_48 = puVar12;
      iVar3 = getNum(local_78 + ctl->eaten,puVar12,ctl->opt + 1);
      lVar13 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar3 = getNum(pcVar2 + lVar13,val,ctl->opt + 2);
      lVar13 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar3 = getNum(pcVar2 + lVar13,&tp1,(int8_t *)&n);
      lVar13 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar3 = getNum(pcVar2 + lVar13,&tp2,&c);
      lVar13 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar3 = getNum(pcVar2 + lVar13,&tp3,&to3);
      ctl->eaten = ctl->eaten + iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((int)*local_48 < 0) {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((int)*(uint32_t *)local_58 < 1) {
        return -2;
      }
      if ((char)n != '\x01') {
        return -2;
      }
      if (c != '\x01') {
        return -2;
      }
      if (to3 != '\x01') {
        return -2;
      }
      *local_68 = tp1;
      local_68[1] = tp2;
      local_68[2] = tp3;
      for (lVar13 = 0; (int)lVar13 != 0x200; lVar13 = lVar13 + 1) {
        iVar3 = getNum(local_78 + ctl->eaten,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || (0xff < tp1)) {
          p[3] = (int)lVar13 + 0xc;
          goto LAB_00121906;
        }
        *(char *)((long)local_68 + lVar13 + 0xc) = (char)tp1;
        ctl->eaten = ctl->eaten + iVar3;
      }
      p[3] = 0x20c;
      break;
    case 0xc5:
      for (lVar13 = 0; (int)lVar13 != 0x200; lVar13 = lVar13 + 1) {
        iVar3 = getNum(local_78 + ctl->eaten,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || (0xff < tp1)) goto LAB_00121901;
        *(char *)((long)local_68 + lVar13) = (char)tp1;
        ctl->eaten = ctl->eaten + iVar3;
      }
LAB_0012190f:
      p[3] = 0x200;
      break;
    default:
      return -2;
    }
  }
switchD_00120b7a_caseD_65:
  return (int)lVar14;
LAB_00121901:
  p[3] = (uint32_t)lVar13;
LAB_00121906:
  if ((int)lVar13 == 0) {
    return -2;
  }
  goto switchD_00120b7a_caseD_65;
}

Assistant:

int cmdParse(
   char *buf, uint32_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uint32_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}